

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_lockbitmap.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long *plVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ushort uVar14;
  ushort uVar15;
  ulong uVar16;
  uint uVar17;
  char *pcVar18;
  bool bVar19;
  bool bVar20;
  int local_8c;
  ALLEGRO_EVENT event;
  
  cVar2 = al_install_system(0x85020700,atexit);
  if (cVar2 == '\0') goto LAB_001027bf;
  al_install_keyboard();
  al_install_mouse();
  al_install_touch_input();
  lVar4 = al_create_display(0x300,0x100);
  if (lVar4 == 0) {
    pcVar18 = "Error creating display\n";
LAB_001027b8:
    do {
      abort_example(pcVar18);
LAB_001027bf:
      pcVar18 = "Could not init Allegro.\n";
    } while( true );
  }
  uVar5 = al_create_event_queue();
  uVar6 = al_get_keyboard_event_source();
  al_register_event_source(uVar5,uVar6);
  uVar6 = al_get_mouse_event_source();
  al_register_event_source(uVar5,uVar6);
  cVar2 = al_is_touch_input_installed();
  if (cVar2 != '\0') {
    uVar6 = al_get_touch_input_mouse_emulation_event_source();
    al_register_event_source(uVar5,uVar6);
  }
  log_printf("Press space to change bitmap type\n");
  log_printf("Press w to toggle WRITEONLY mode\n");
  uVar11 = 2;
  local_8c = 0;
  cVar2 = '\0';
LAB_001024f6:
  bVar19 = true;
  do {
    pcVar18 = " in write-only mode\n";
    if (uVar11 == 0) {
      pcVar18 = " in read/write mode\n";
    }
    if (bVar19) {
      if (cVar2 == '\x01') {
        log_printf("Locking memory bitmap");
        al_map_rgb(0,0,0);
        al_clear_to_color();
        uVar6 = 1;
LAB_00102568:
        al_set_new_bitmap_flags(uVar6);
        lVar7 = al_create_bitmap(0x300,0x100);
      }
      else {
        if (cVar2 == '\0') {
          log_printf("Locking video bitmap");
          al_map_rgb(0,0,0);
          al_clear_to_color();
          uVar6 = 0x400;
          goto LAB_00102568;
        }
        log_printf("Locking display backbuffer");
        lVar7 = al_get_backbuffer(lVar4);
      }
      if (lVar7 == 0) {
        pcVar18 = "Error creating bitmap";
        goto LAB_001027b8;
      }
      log_printf(pcVar18);
      al_set_target_bitmap(lVar7);
      al_map_rgb_f(0x3f4ccccd,0x3f4ccccd,0x3f666666);
      al_clear_to_color();
      al_set_target_backbuffer(lVar4);
      plVar8 = (long *)al_lock_bitmap_region(lVar7,0xc1,0x41,0x17d,0x7f,0xd,uVar11);
      if (plVar8 != (long *)0x0) {
        lVar9 = *plVar8;
        iVar3 = *(int *)((long)plVar8 + 0xc);
        for (uVar10 = 0; uVar10 != 0x7f; uVar10 = uVar10 + 1) {
          uVar1 = (int)uVar10 * 2;
          uVar14 = (ushort)((byte)((uVar10 & 0xffffffff) >> 2) & 0x3f) << 0xb;
          for (lVar13 = 0; uVar12 = (uint)lVar13, uVar12 != 0x17d; lVar13 = lVar13 + 1) {
            uVar16 = 0;
            uVar15 = 0;
            if (uVar12 == 0x17c) {
              uVar17 = 0;
            }
            else {
              uVar17 = 0;
              if (uVar12 != 0 && (uVar10 != 0x7e && uVar10 != 0)) {
                uVar16 = (ulong)uVar1;
                uVar17 = uVar1;
                uVar15 = 0xf800;
                if (0x7e < uVar12) {
                  uVar17 = uVar1 & 0xff;
                  uVar16 = (ulong)uVar17;
                  uVar15 = uVar14;
                  if (uVar12 < 0xfe) {
                    uVar16 = 0xff;
                  }
                  else {
                    uVar17 = 0xff;
                  }
                }
              }
            }
            if ((uVar11 != 0) || (((int)uVar10 + uVar12 & 1) != 0)) {
              *(ushort *)(lVar9 + lVar13 * 2) =
                   (ushort)(uVar17 >> 3) & 0x1f | uVar15 | (ushort)((byte)(uVar16 >> 2) & 0x3f) << 5
              ;
            }
          }
          lVar9 = lVar9 + iVar3;
        }
        al_unlock_bitmap(lVar7);
      }
      if (cVar2 != '\x02') {
        al_draw_bitmap(0,0,lVar7,0);
        al_destroy_bitmap(lVar7);
      }
      al_flip_display();
    }
    while (al_wait_for_event(uVar5), event.type != 0xb) {
      if ((event.type == 0x15) && (event.mouse.button == 1)) {
        iVar3 = al_get_display_width(lVar4);
        if (event.display.width < iVar3 / 2) goto LAB_00102781;
        uVar11 = uVar11 ^ 2;
        goto LAB_001024f6;
      }
    }
    if (event.display.width == 0x3b) {
      return 0;
    }
    if (event.display.height == 0x20) break;
    bVar19 = (event.display.height & 0xffffffdfU) == 0x57;
    if (bVar19) {
      uVar11 = uVar11 ^ 2;
    }
  } while( true );
LAB_00102781:
  bVar19 = local_8c == 1;
  local_8c = (uint)bVar19 * 2;
  bVar20 = cVar2 == '\0';
  cVar2 = bVar19 * '\x02';
  if (bVar20) {
    local_8c = 1;
    cVar2 = '\x01';
  }
  goto LAB_001024f6;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_EVENT_QUEUE *events;
   ALLEGRO_EVENT event;
   enum Mode mode = MODE_VIDEO;
   int lock_flags = ALLEGRO_LOCK_WRITEONLY;
   bool redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_install_mouse();
   al_install_touch_input();

   open_log();

   /* Create a window. */
   display = al_create_display(3*256, 256);
   if (!display) {
      abort_example("Error creating display\n");
   }

   events = al_create_event_queue();
   al_register_event_source(events, al_get_keyboard_event_source());
   al_register_event_source(events, al_get_mouse_event_source());
   if (al_is_touch_input_installed()) {
      al_register_event_source(events,
         al_get_touch_input_mouse_emulation_event_source());
   }

   log_printf("Press space to change bitmap type\n");
   log_printf("Press w to toggle WRITEONLY mode\n");

   for (;;) {
      if (redraw) {
         draw(display, mode, lock_flags);
         redraw = false;
      }

      al_wait_for_event(events, &event);
      if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
            break;
         if (event.keyboard.unichar == ' ') {
            mode = cycle_mode(mode);
            redraw = true;
         }
         else if (event.keyboard.unichar == 'w' || event.keyboard.unichar == 'W') {
            lock_flags = toggle_writeonly(lock_flags);
            redraw = true;
         }
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         if (event.mouse.button == 1) {
            if (event.mouse.x < al_get_display_width(display) / 2) {
               mode = cycle_mode(mode);
            }
            else {
               lock_flags = toggle_writeonly(lock_flags);
            }
            redraw = true;
         }
      }
   }

   close_log(false);
   return 0;
}